

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::Parse3DFace(DXFImporter *this,LineReader *reader,FileData *output)

{
  pointer pBVar1;
  byte bVar2;
  string *psVar3;
  element_type *peVar4;
  element_type *this_00;
  uint uVar5;
  PolyLine *__p;
  Logger *this_01;
  bool bVar6;
  uint i;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  aiVector3D *__x;
  float fVar10;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  uint local_98;
  uint cnt;
  element_type *local_90;
  aiVector3D vip [4];
  aiColor4D clr;
  
  pBVar1 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __p = (PolyLine *)operator_new(0xa8);
  (__p->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p->flags = 0;
  (__p->layer)._M_dataplus._M_p = (pointer)&(__p->layer).field_2;
  (__p->layer)._M_string_length = 0;
  (__p->layer).field_2._M_local_buf[0] = '\0';
  (__p->desc)._M_dataplus._M_p = (pointer)&(__p->desc).field_2;
  (__p->desc)._M_string_length = 0;
  (__p->desc).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<Assimp::DXF::PolyLine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::DXF::PolyLine,void>
            ((__shared_ptr<Assimp::DXF::PolyLine,(__gnu_cxx::_Lock_policy)2> *)vip,__p);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
  ::emplace_back<std::shared_ptr<Assimp::DXF::PolyLine>>
            ((vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
              *)(pBVar1 + -1),(shared_ptr<Assimp::DXF::PolyLine> *)vip);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vip[0].z);
  local_90 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].lines.
             super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  vip[2].z = 0.0;
  vip[3].x = 0.0;
  vip[3].y = 0.0;
  vip[3].z = 0.0;
  vip[1].y = 0.0;
  vip[1].z = 0.0;
  vip[2].x = 0.0;
  vip[2].y = 0.0;
  vip[0].x = 0.0;
  vip[0].y = 0.0;
  vip[0].z = 0.0;
  vip[1].x = 0.0;
  clr = AI_DXF_DEFAULT_COLOR;
  psVar3 = &local_90->layer;
  local_ac = 0.0;
  bVar6 = false;
  local_b0 = 0.0;
  local_a4 = 0.0;
  local_a8 = 0.0;
  local_9c = 0.0;
  local_a0 = 0.0;
  bVar9 = false;
  bVar8 = 0;
  bVar2 = 0;
  while (peVar4 = local_90, reader->end < 2) {
    switch(reader->groupcode) {
    case 0:
      goto switchD_003fbb5f_caseD_0;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 9:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
      break;
    case 8:
      std::__cxx11::string::_M_assign((string *)psVar3);
      break;
    case 10:
      fVar10 = DXF::LineReader::ValueAsFloat(reader);
      vip[0].x = fVar10;
      goto LAB_003fbc66;
    case 0xb:
      fVar10 = DXF::LineReader::ValueAsFloat(reader);
      vip[1].x = fVar10;
      goto LAB_003fbc91;
    case 0xc:
      local_9c = DXF::LineReader::ValueAsFloat(reader);
      vip[2].x = local_9c;
      goto LAB_003fbc7f;
    case 0xd:
      local_a0 = DXF::LineReader::ValueAsFloat(reader);
      vip[3].x = local_a0;
      goto LAB_003fbc2d;
    case 0x14:
      fVar10 = DXF::LineReader::ValueAsFloat(reader);
      vip[0].y = fVar10;
      goto LAB_003fbc66;
    case 0x15:
      fVar10 = DXF::LineReader::ValueAsFloat(reader);
      vip[1].y = fVar10;
      goto LAB_003fbc91;
    case 0x16:
      local_a4 = DXF::LineReader::ValueAsFloat(reader);
      vip[2].y = local_a4;
      goto LAB_003fbc7f;
    case 0x17:
      local_a8 = DXF::LineReader::ValueAsFloat(reader);
      vip[3].y = local_a8;
      goto LAB_003fbc2d;
    case 0x1e:
      fVar10 = DXF::LineReader::ValueAsFloat(reader);
      vip[0].z = fVar10;
LAB_003fbc66:
      bVar8 = 1;
      break;
    case 0x1f:
      fVar10 = DXF::LineReader::ValueAsFloat(reader);
      vip[1].z = fVar10;
LAB_003fbc91:
      bVar2 = 1;
      break;
    case 0x20:
      local_ac = DXF::LineReader::ValueAsFloat(reader);
      vip[2].z = local_ac;
LAB_003fbc7f:
      bVar6 = true;
      break;
    case 0x21:
      local_b0 = DXF::LineReader::ValueAsFloat(reader);
      vip[3].z = local_b0;
LAB_003fbc2d:
      bVar9 = true;
      break;
    default:
      if (reader->groupcode == 0x3e) {
        uVar5 = DXF::LineReader::ValueAsUnsignedInt(reader);
        clr = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + (ulong)((uVar5 & 0xf) << 4));
      }
    }
    DXF::LineReader::operator++(reader);
  }
switchD_003fbb5f_caseD_0:
  if (((((local_a0 != local_9c) || (NAN(local_a0) || NAN(local_9c))) || (local_a8 != local_a4)) ||
      ((NAN(local_a8) || NAN(local_a4) || (local_b0 != local_ac)))) ||
     (NAN(local_b0) || NAN(local_ac))) {
    if ((bVar9) && (!bVar6)) goto LAB_003fbd7d;
  }
  else {
    bVar9 = false;
  }
  if ((bool)(bVar8 & bVar2)) {
    __x = vip;
    cnt = (uint)(byte)(bVar9 + bVar6 + 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&local_90->counts,&cnt);
    this_00 = local_90;
    for (uVar7 = 0; uVar7 < cnt; uVar7 = uVar7 + 1) {
      local_98 = (uint)(((long)(this_00->positions).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->positions).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&peVar4->indices,&local_98);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&this_00->positions,__x);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (&peVar4->colors,&clr);
      __x = __x + 1;
    }
    return;
  }
LAB_003fbd7d:
  this_01 = DefaultLogger::get();
  Logger::warn(this_01,"DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ::pop_back(&(output->blocks).
              super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].lines);
  return;
}

Assistant:

void DXFImporter::Parse3DFace(DXF::LineReader& reader, DXF::FileData& output)
{
    // (note) this is also used for for parsing line entities, so we
    // must handle the vertex_count == 2 case as well.

    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() )  );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    aiVector3D vip[4];
    aiColor4D  clr = AI_DXF_DEFAULT_COLOR;

    bool b[4] = {false,false,false,false};
    while( !reader.End() ) {

        // next entity with a groupcode == 0 is probably already the next vertex or polymesh entity
        if (reader.GroupCode() == 0) {
            break;
        }
        switch (reader.GroupCode())
        {

        // 8 specifies the layer
        case 8:
            line.layer = reader.Value();
            break;

        // x position of the first corner
        case 10:
            vip[0].x = reader.ValueAsFloat();
            b[2] = true;
            break;

        // y position of the first corner
        case 20:
            vip[0].y = reader.ValueAsFloat();
            b[2] = true;
            break;

        // z position of the first corner
        case 30:
            vip[0].z = reader.ValueAsFloat();
            b[2] = true;
            break;

        // x position of the second corner
        case 11:
            vip[1].x = reader.ValueAsFloat();
            b[3] = true;
            break;

        // y position of the second corner
        case 21:
            vip[1].y = reader.ValueAsFloat();
            b[3] = true;
            break;

        // z position of the second corner
        case 31:
            vip[1].z = reader.ValueAsFloat();
            b[3] = true;
            break;

        // x position of the third corner
        case 12:
            vip[2].x = reader.ValueAsFloat();
            b[0] = true;
            break;

        // y position of the third corner
        case 22:
            vip[2].y = reader.ValueAsFloat();
            b[0] = true;
            break;

        // z position of the third corner
        case 32:
            vip[2].z = reader.ValueAsFloat();
            b[0] = true;
            break;

        // x position of the fourth corner
        case 13:
            vip[3].x = reader.ValueAsFloat();
            b[1] = true;
            break;

        // y position of the fourth corner
        case 23:
            vip[3].y = reader.ValueAsFloat();
            b[1] = true;
            break;

        // z position of the fourth corner
        case 33:
            vip[3].z = reader.ValueAsFloat();
            b[1] = true;
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        ++reader;
    }

    // the fourth corner may even be identical to the third,
    // in this case we treat it as if it didn't exist.
    if (vip[3] == vip[2]) {
        b[1] = false;
    }

    // sanity checks to see if we got something meaningful
    if ((b[1] && !b[0]) || !b[2] || !b[3]) {
        ASSIMP_LOG_WARN("DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
        output.blocks.back().lines.pop_back();
        return;
    }

    const unsigned int cnt = (2+(b[0]?1:0)+(b[1]?1:0));
    line.counts.push_back(cnt);

    for (unsigned int i = 0; i < cnt; ++i) {
        line.indices.push_back(static_cast<unsigned int>(line.positions.size()));
        line.positions.push_back(vip[i]);
        line.colors.push_back(clr);
    }
}